

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::variable_decl_function_local_abi_cxx11_
          (CompilerGLSL *this,SPIRVariable *var)

{
  undefined4 uVar1;
  long in_RDX;
  StorageClass old_storage;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  string *expr;
  
  uVar1 = *(undefined4 *)(in_RDX + 0x10);
  *(undefined4 *)(in_RDX + 0x10) = 7;
  (*(var->super_IVariant)._vptr_IVariant[0x26])(this,var,in_RDX);
  *(undefined4 *)(in_RDX + 0x10) = uVar1;
  return this;
}

Assistant:

string CompilerGLSL::variable_decl_function_local(SPIRVariable &var)
{
	// These variables are always function local,
	// so make sure we emit the variable without storage qualifiers.
	// Some backends will inject custom variables locally in a function
	// with a storage qualifier which is not function-local.
	auto old_storage = var.storage;
	var.storage = StorageClassFunction;
	auto expr = variable_decl(var);
	var.storage = old_storage;
	return expr;
}